

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O3

void absl::lts_20250127::LockEnter(Mutex *mu,GraphId id,SynchLocksHeld *held_locks)

{
  int *piVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  
  uVar2 = held_locks->n;
  uVar3 = (ulong)uVar2;
  if (uVar3 == 0) {
    uVar3 = 0;
  }
  else {
    lVar4 = 0;
    do {
      if (*(uint64_t *)((long)&held_locks->locks[0].id.handle + lVar4) == id.handle) {
        piVar1 = (int *)((long)&held_locks->locks[0].count + lVar4);
        *piVar1 = *piVar1 + 1;
        return;
      }
      lVar4 = lVar4 + 0x18;
    } while (uVar3 * 0x18 != lVar4);
    if (uVar3 == 0x28) {
      held_locks->overflow = true;
      return;
    }
  }
  held_locks->locks[uVar3].mu = mu;
  held_locks->locks[uVar3].count = 1;
  held_locks->locks[uVar3].id.handle = id.handle;
  held_locks->n = uVar2 + 1;
  return;
}

Assistant:

static void LockEnter(Mutex* mu, GraphId id, SynchLocksHeld* held_locks) {
  int n = held_locks->n;
  int i = 0;
  while (i != n && held_locks->locks[i].id != id) {
    i++;
  }
  if (i == n) {
    if (n == ABSL_ARRAYSIZE(held_locks->locks)) {
      held_locks->overflow = true;  // lost some data
    } else {                        // we have room for lock
      held_locks->locks[i].mu = mu;
      held_locks->locks[i].count = 1;
      held_locks->locks[i].id = id;
      held_locks->n = n + 1;
    }
  } else {
    held_locks->locks[i].count++;
  }
}